

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_padding_to_temp(archive_write *a,int64_t csize)

{
  undefined4 local_24;
  int ret;
  size_t ns;
  int64_t csize_local;
  archive_write *a_local;
  
  if (csize % 0x800 == 0) {
    local_24 = 0;
  }
  else {
    local_24 = write_null(a,0x800 - csize % 0x800);
  }
  return local_24;
}

Assistant:

static int
wb_write_padding_to_temp(struct archive_write *a, int64_t csize)
{
	size_t ns;
	int ret;

	ns = (size_t)(csize % LOGICAL_BLOCK_SIZE);
	if (ns != 0)
		ret = write_null(a, LOGICAL_BLOCK_SIZE - ns);
	else
		ret = ARCHIVE_OK;
	return (ret);
}